

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseAccess.cpp
# Opt level: O0

int __thiscall
bhf::ads::TcLicenseOnlineInfo::ShowOrderNo(TcLicenseOnlineInfo *this,ostream *os,AdsDevice *device)

{
  byte bVar1;
  size_type readLength;
  char *pcVar2;
  ostream *poVar3;
  void *this_00;
  reference pvVar4;
  string local_210 [32];
  stringstream local_1f0 [8];
  stringstream stream;
  ostream local_1e0 [376];
  long local_68;
  long status;
  allocator_type local_49;
  undefined1 local_48 [8];
  vector<char,_std::allocator<char>_> readBuffer;
  uint32_t bytesRead;
  AdsDevice *device_local;
  ostream *os_local;
  TcLicenseOnlineInfo *this_local;
  
  readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_48,0x10,&local_49);
  std::allocator<char>::~allocator(&local_49);
  readLength = std::vector<char,_std::allocator<char>_>::capacity
                         ((vector<char,_std::allocator<char>_> *)local_48);
  pcVar2 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_48);
  local_68 = AdsDevice::ReadWriteReqEx2
                       (device,0x101000d,0,readLength,pcVar2,0x10,this,
                        (uint32_t *)
                        &readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         field_0x14);
  if (local_68 == 0) {
    if ((uint)readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ < 2) {
      std::operator<<(os,"N/A");
    }
    else {
      pvVar4 = std::vector<char,_std::allocator<char>_>::back
                         ((vector<char,_std::allocator<char>_> *)local_48);
      *pvVar4 = '\0';
      pcVar2 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)local_48);
      std::operator<<(os,pcVar2);
    }
    bVar1 = std::ios::good();
    this_local._4_4_ = (uint)((bVar1 ^ 0xff) & 1);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1f0);
    poVar3 = std::operator<<(local_1e0,"ShowOrderNo");
    poVar3 = std::operator<<(poVar3,"(): failed with: 0x");
    this_00 = (void *)std::ostream::operator<<(poVar3,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(this_00,local_68);
    std::operator<<(poVar3,'\n');
    std::__cxx11::stringstream::str();
    Logger::Log(3,local_210);
    std::__cxx11::string::~string((string *)local_210);
    std::__cxx11::stringstream::~stringstream(local_1f0);
    this_local._4_4_ = 1;
  }
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_48)
  ;
  return this_local._4_4_;
}

Assistant:

int ShowOrderNo(std::ostream& os, const AdsDevice& device) const
    {
        uint32_t bytesRead = 0;
        auto readBuffer = std::vector<char>(16);
        const auto status = device.ReadWriteReqEx2(0x0101000D,
                                                   0x0,
                                                   readBuffer.capacity(),
                                                   readBuffer.data(),
                                                   sizeof(licenseId),
                                                   &licenseId,
                                                   &bytesRead);
        if (ADSERR_NOERR != status) {
            LOG_ERROR(__FUNCTION__ << "(): failed with: 0x" << std::hex << status << '\n');
            return 1;
        }

        if (1 < bytesRead) {
            // Ensure the order number is NULL terminated.
            readBuffer.back() = '\0';
            os << readBuffer.data();
        } else {
            os << "N/A";
        }
        return !os.good();
    }